

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void * RunTraditionalPQExperiment(void *threadarg)

{
  uint64_t uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  allocator<char> local_5d;
  uint seed;
  int *local_58;
  string local_50;
  
  seed = 0;
  uVar1 = rdtsc();
  iVar4 = (int)(10000000 / (long)threadsCount);
  uVar3 = 0;
  if (0 < iVar4) {
    uVar3 = 10000000 / (long)threadsCount & 0xffffffff;
  }
  while ((int)uVar3 != 0) {
    iVar2 = rand_r(&seed);
    Multiqueues<int>::insertByThreadId(priorityQueue,iVar2 % 1000000);
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"INSERT",&local_5d);
  saveThroughput(&local_50,*threadarg,uVar1,(long)iVar4);
  std::__cxx11::string::~string((string *)&local_50);
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  uVar1 = rdtsc();
  iVar4 = (int)(5000000 / (long)threadsCount);
  uVar3 = 0;
  if (0 < iVar4) {
    uVar3 = 5000000 / (long)threadsCount & 0xffffffff;
  }
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    Multiqueues<int>::deleteMaxByThreadOwn(priorityQueue);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"DELETE",&local_5d);
  local_58 = (int *)threadarg;
  saveThroughput(&local_50,*threadarg,uVar1,(long)iVar4);
  std::__cxx11::string::~string((string *)&local_50);
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  seed = 0;
  uVar3 = 0;
  uVar1 = rdtsc();
  iVar4 = (int)(4000000 / (long)threadsCount);
  if (0 < iVar4) {
    uVar3 = 4000000 / (long)threadsCount & 0xffffffff;
  }
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    iVar2 = rand_r(&seed);
    if (iVar2 % 3 == 0) {
      Multiqueues<int>::deleteMaxByThreadOwn(priorityQueue);
    }
    else {
      iVar2 = rand_r(&seed);
      Multiqueues<int>::insertByThreadId(priorityQueue,iVar2 % 1000000);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"RANDOM",&local_5d);
  saveThroughput(&local_50,*local_58,uVar1,(long)iVar4);
  std::__cxx11::string::~string((string *)&local_50);
  return (void *)0x0;
}

Assistant:

void *RunTraditionalPQExperiment(void *threadarg) {
    struct threadData *threadData;
    threadData = (struct threadData *) threadarg;

    unsigned int seed = 0;
    int operationsCount = INSERT_ELEMENTS / threadsCount;

    uint64_t start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
        priorityQueue->insertByThreadId(insertedNum);
    }
    saveThroughput("INSERT", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    int *a;
    operationsCount = DELETE_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        priorityQueue->deleteMaxByThreadOwn();
    }
    saveThroughput("DELETE", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    seed = 0;
    operationsCount = RANDOM_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int mode = rand_r(&seed) % 3;
        if (mode == 0) {
            priorityQueue->deleteMaxByThreadOwn();
        } else {
            int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
            priorityQueue->insertByThreadId(insertedNum);
        }
    }
    saveThroughput("RANDOM", threadData->threadId, start, operationsCount);

    return nullptr;
}